

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

char * nifti_datatype_to_string(int dtype)

{
  char **ppcVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = 0x2a;
  ppcVar1 = &nifti_type_list[0x2a].name;
  uVar2 = 0x2a;
  while( true ) {
    bVar4 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if ((bVar4) || (nifti_type_list[uVar3].type == dtype)) break;
    ppcVar1 = ppcVar1 + -3;
    uVar3 = (ulong)uVar2;
  }
  return *ppcVar1;
}

Assistant:

const char * nifti_datatype_to_string( int dtype )
{
    int tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int c;

    for( c = tablen-1; c > 0; c-- )
        if( nifti_type_list[c].type == dtype )
            break;

    return nifti_type_list[c].name;
}